

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_hash.c
# Opt level: O0

err_t bashHash(octet *hash,size_t l,void *src,size_t count)

{
  bool_t bVar1;
  blob_t state_00;
  size_t in_RCX;
  octet *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  void *state;
  size_t in_stack_ffffffffffffffc8;
  err_t local_4;
  
  if (((in_RSI == 0) || ((in_RSI & 0xf) != 0)) || (0x100 < in_RSI)) {
    local_4 = 0x1f6;
  }
  else {
    bVar1 = memIsValid(in_RDX,in_RCX);
    if ((bVar1 != 0) && (bVar1 = memIsValid(in_RDI,in_RSI >> 2), bVar1 != 0)) {
      bashHash_keep();
      state_00 = blobCreate(in_stack_ffffffffffffffc8);
      if (state_00 == (blob_t)0x0) {
        return 0x6e;
      }
      bashHashStart(state_00,in_stack_ffffffffffffffc8);
      bashHashStepH(in_RDX,in_RCX,state_00);
      bashHashStepG(in_RDX,in_RCX,state_00);
      blobClose((blob_t)0x144a16);
      return 0;
    }
    local_4 = 0x6d;
  }
  return local_4;
}

Assistant:

err_t bashHash(octet hash[], size_t l, const void* src, size_t count)
{
	void* state;
	// проверить входные данные
	if (l == 0 || l % 16 != 0 || l > 256)
		return ERR_BAD_PARAMS;
	if (!memIsValid(src, count) || !memIsValid(hash, l / 4))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(bashHash_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// вычислить хэш-значение
	bashHashStart(state, l);
	bashHashStepH(src, count, state);
	bashHashStepG(hash, l / 4, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}